

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void reslot_weapon(CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *pOVar2;
  CHAR_DATA *in_RDI;
  OBJ_DATA *secondary;
  OBJ_DATA *primary;
  bool in_stack_00000027;
  OBJ_DATA *in_stack_00000028;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  OBJ_DATA *in_stack_00000038;
  CHAR_DATA *in_stack_00000040;
  
  pOVar1 = get_eq_char(in_RDI,0x10);
  pOVar2 = get_eq_char(in_RDI,0x12);
  if (((pOVar1 == (OBJ_DATA *)0x0) && (pOVar2 != (OBJ_DATA *)0x0)) &&
     (unequip_char((CHAR_DATA *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_00000028,
                   in_stack_00000027), pOVar2 != (OBJ_DATA *)0x0)) {
    equip_char(in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030._3_1_);
  }
  return;
}

Assistant:

void reslot_weapon(CHAR_DATA *ch)
{
	OBJ_DATA *primary = get_eq_char(ch, WEAR_WIELD);
	OBJ_DATA *secondary = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (primary == nullptr && secondary != nullptr)
	{
		unequip_char(ch, secondary, false);

		if (secondary == nullptr)
			return;

		equip_char(ch, secondary, WEAR_WIELD, false);

		primary = secondary;
		secondary = nullptr;
	}
}